

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jinx.hpp
# Opt level: O3

FunctionMatch * __thiscall
Jinx::Impl::Parser::CheckFunctionCall
          (FunctionMatch *__return_storage_ptr__,Parser *this,LibraryIPtr *library,
          SymbolListCItr currSym,SymbolListCItr endSym,bool skipInitialParam)

{
  element_type *peVar1;
  pointer pFVar2;
  pointer ppFVar3;
  int iVar4;
  pointer ppFVar5;
  FunctionSignature *fn;
  pointer pFVar6;
  FunctionPtrList functionPtrList;
  SymbolListCItr currentSymbol;
  FunctionMatch newMatch;
  _Vector_base<const_Jinx::Impl::FunctionSignature_*,_Jinx::Allocator<const_Jinx::Impl::FunctionSignature_*>_>
  local_78;
  SymbolListCItr local_60;
  SymbolListCItr local_58;
  FunctionMatch local_50;
  
  peVar1 = (library->super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_60._M_current = currSym._M_current;
  local_58._M_current = endSym._M_current;
  iVar4 = pthread_mutex_lock((pthread_mutex_t *)&peVar1->m_functionMutex);
  if (iVar4 == 0) {
    local_78._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_78._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_78._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<const_Jinx::Impl::FunctionSignature_*,_Jinx::Allocator<const_Jinx::Impl::FunctionSignature_*>_>
    ::reserve((vector<const_Jinx::Impl::FunctionSignature_*,_Jinx::Allocator<const_Jinx::Impl::FunctionSignature_*>_>
               *)&local_78,
              ((long)(peVar1->m_functionList).
                     super__Vector_base<Jinx::Impl::FunctionSignature,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignature,_4096UL,_16UL>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(peVar1->m_functionList).
                     super__Vector_base<Jinx::Impl::FunctionSignature,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignature,_4096UL,_16UL>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5) * -0x5075075075075075);
    pFVar6 = (peVar1->m_functionList).
             super__Vector_base<Jinx::Impl::FunctionSignature,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignature,_4096UL,_16UL>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pFVar2 = (peVar1->m_functionList).
             super__Vector_base<Jinx::Impl::FunctionSignature,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignature,_4096UL,_16UL>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pFVar6 != pFVar2) {
      do {
        local_50.signature = pFVar6;
        std::
        vector<Jinx::Impl::FunctionSignature_const*,Jinx::Allocator<Jinx::Impl::FunctionSignature_const*>>
        ::emplace_back<Jinx::Impl::FunctionSignature_const*>
                  ((vector<Jinx::Impl::FunctionSignature_const*,Jinx::Allocator<Jinx::Impl::FunctionSignature_const*>>
                    *)&local_78,&local_50.signature);
        pFVar6 = pFVar6 + 1;
      } while (pFVar6 != pFVar2);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&peVar1->m_functionMutex);
    ppFVar3 = local_78._M_impl.super__Vector_impl_data._M_finish;
    __return_storage_ptr__->signature = (FunctionSignature *)0x0;
    (__return_storage_ptr__->partData).
    super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->partData).
    super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->partData).
    super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (local_78._M_impl.super__Vector_impl_data._M_start !=
        local_78._M_impl.super__Vector_impl_data._M_finish) {
      ppFVar5 = local_78._M_impl.super__Vector_impl_data._M_start;
      do {
        CheckFunctionCall(&local_50,this,*ppFVar5,local_60,local_58,skipInitialParam);
        if ((local_50.signature != (pointer)0x0) &&
           ((__return_storage_ptr__->signature == (FunctionSignature *)0x0 ||
            ((ulong)((long)(__return_storage_ptr__->partData).
                           super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(__return_storage_ptr__->partData).
                          super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
                          ._M_impl.super__Vector_impl_data._M_start) <
             (ulong)((long)local_50.partData.
                           super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_50.partData.
                          super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
                          ._M_impl.super__Vector_impl_data._M_start))))) {
          __return_storage_ptr__->signature = local_50.signature;
          std::
          vector<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
          ::operator=(&__return_storage_ptr__->partData,&local_50.partData);
        }
        std::
        _Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
        ::~_Vector_base(&local_50.partData.
                         super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
                       );
        ppFVar5 = ppFVar5 + 1;
      } while (ppFVar5 != ppFVar3);
    }
    std::
    _Vector_base<const_Jinx::Impl::FunctionSignature_*,_Jinx::Allocator<const_Jinx::Impl::FunctionSignature_*>_>
    ::~_Vector_base(&local_78);
    return __return_storage_ptr__;
  }
  std::__throw_system_error(iVar4);
}

Assistant:

inline Parser::FunctionMatch Parser::CheckFunctionCall(LibraryIPtr library, SymbolListCItr currSym, SymbolListCItr endSym, bool skipInitialParam) const
	{
		const auto functionPtrList = library->Functions();

		FunctionMatch match;
		for (const auto functionSig : functionPtrList)
		{
			auto currentSymbol = currSym;
			auto newMatch = CheckFunctionCall(*functionSig, currentSymbol, endSym, skipInitialParam);
			if (newMatch.signature)
			{
				if (!match.signature || match.partData.size() < newMatch.partData.size())
					match = newMatch;
			}
		}
		return match;
	}